

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  ImGuiIO::ImGuiIO(&this->IO);
  ImGuiStyle::ImGuiStyle(&this->Style);
  (this->FontTexUvWhitePixel).x = 0.0;
  (this->FontTexUvWhitePixel).y = 0.0;
  (this->CurrentWindowStack).Size = 0;
  (this->CurrentWindowStack).Capacity = 0;
  (this->CurrentWindowStack).Data = (ImGuiWindow **)0x0;
  (this->ActiveIdClickOffset).x = 0.0;
  (this->ActiveIdClickOffset).y = 0.0;
  (this->Settings).Size = 0;
  (this->Settings).Capacity = 0;
  (this->Settings).Data = (ImGuiIniData *)0x0;
  (this->Windows).Size = 0;
  (this->Windows).Capacity = 0;
  (this->Windows).Data = (ImGuiWindow **)0x0;
  (this->WindowsSortBuffer).Size = 0;
  (this->WindowsSortBuffer).Capacity = 0;
  (this->WindowsSortBuffer).Data = (ImGuiWindow **)0x0;
  (this->ColorModifiers).Size = 0;
  (this->ColorModifiers).Capacity = 0;
  (this->ColorModifiers).Data = (ImGuiColMod *)0x0;
  (this->StyleModifiers).Size = 0;
  (this->StyleModifiers).Capacity = 0;
  (this->StyleModifiers).Data = (ImGuiStyleMod *)0x0;
  (this->FontStack).Size = 0;
  (this->FontStack).Capacity = 0;
  (this->FontStack).Data = (ImFont **)0x0;
  (this->OpenPopupStack).Size = 0;
  (this->OpenPopupStack).Capacity = 0;
  (this->OpenPopupStack).Data = (ImGuiPopupRef *)0x0;
  (this->CurrentPopupStack).Size = 0;
  (this->CurrentPopupStack).Capacity = 0;
  (this->CurrentPopupStack).Data = (ImGuiPopupRef *)0x0;
  (this->SetNextWindowContentSizeVal).x = 0.0;
  (this->SetNextWindowContentSizeVal).y = 0.0;
  (this->SetNextWindowPosVal).x = 0.0;
  (this->SetNextWindowPosVal).y = 0.0;
  (this->SetNextWindowSizeVal).x = 0.0;
  (this->SetNextWindowSizeVal).y = 0.0;
  (this->SetNextWindowSizeConstraintRect).Min.x = 3.4028235e+38;
  (this->SetNextWindowSizeConstraintRect).Min.y = 3.4028235e+38;
  (this->SetNextWindowSizeConstraintRect).Max.x = -3.4028235e+38;
  (this->SetNextWindowSizeConstraintRect).Max.y = -3.4028235e+38;
  (this->RenderDrawData).Valid = false;
  (this->RenderDrawData).CmdLists = (ImDrawList **)0x0;
  (this->RenderDrawData).CmdListsCount = 0;
  (this->RenderDrawData).TotalVtxCount = 0;
  (this->RenderDrawData).TotalIdxCount = 0;
  this->RenderDrawLists[2].Size = 0;
  this->RenderDrawLists[2].Capacity = 0;
  this->RenderDrawLists[2].Data = (ImDrawList **)0x0;
  this->RenderDrawLists[1].Size = 0;
  this->RenderDrawLists[1].Capacity = 0;
  this->RenderDrawLists[1].Data = (ImDrawList **)0x0;
  this->RenderDrawLists[0].Size = 0;
  this->RenderDrawLists[0].Capacity = 0;
  this->RenderDrawLists[0].Data = (ImDrawList **)0x0;
  ImDrawList::ImDrawList(&this->OverlayDrawList);
  lVar2 = 0x1988;
  do {
    puVar1 = (undefined8 *)((long)(this->IO).KeyMap + lVar2 + -0x14);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->IO).KeyMap + lVar2 + -0x24);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->IO).KeyMap + lVar2 + -0x34);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x34;
  } while (lVar2 != 0x1af4);
  memset(&this->InputTextState,0,0xce8);
  ImFont::ImFont(&this->InputTextPasswordFont);
  (this->ColorEditModeStorage).Data.Size = 0;
  (this->ColorEditModeStorage).Data.Capacity = 0;
  (this->ColorEditModeStorage).Data.Data = (Pair *)0x0;
  this->Initialized = false;
  this->Font = (ImFont *)0x0;
  this->FontSize = 0.0;
  this->FontBaseSize = 0.0;
  (this->FontTexUvWhitePixel).x = 0.0;
  (this->FontTexUvWhitePixel).y = 0.0;
  this->Time = 0.0;
  this->FrameCount = 0;
  this->FrameCountEnded = -1;
  this->FrameCountRendered = -1;
  this->CurrentWindow = (ImGuiWindow *)0x0;
  this->FocusedWindow = (ImGuiWindow *)0x0;
  this->HoveredWindow = (ImGuiWindow *)0x0;
  *(undefined8 *)((long)&this->HoveredWindow + 5) = 0;
  *(undefined8 *)((long)&this->HoveredRootWindow + 5) = 0;
  this->HoveredIdPreviousFrame = 0;
  this->ActiveId = 0;
  *(undefined8 *)((long)&this->ActiveId + 3) = 0;
  (this->ActiveIdClickOffset).x = -1.0;
  (this->ActiveIdClickOffset).y = -1.0;
  this->SettingsDirtyTimer = 0.0;
  this->SetNextWindowCollapsedVal = false;
  this->SetNextWindowFocus = false;
  this->SetNextTreeNodeOpenVal = false;
  this->SetNextTreeNodeOpenCond = 0;
  this->ScalarAsInputTextId = 0;
  this->DragCurrentValue = 0.0;
  (this->DragLastMouseDelta).x = 0.0;
  (this->DragLastMouseDelta).y = 0.0;
  this->MovedWindowMoveId = 0;
  this->ActiveIdWindow = (ImGuiWindow *)0x0;
  this->MovedWindow = (ImGuiWindow *)0x0;
  (this->SetNextWindowPosVal).x = 0.0;
  (this->SetNextWindowPosVal).y = 0.0;
  (this->SetNextWindowSizeVal).x = 0.0;
  (this->SetNextWindowSizeVal).y = 0.0;
  this->SetNextWindowPosCond = 0;
  this->SetNextWindowSizeCond = 0;
  this->SetNextWindowContentSizeCond = 0;
  this->SetNextWindowCollapsedCond = 0;
  this->SetNextWindowSizeConstraintCallback = (ImGuiSizeConstraintCallback)0x0;
  this->SetNextWindowSizeConstraintCallbackUserData = (void *)0x0;
  this->DragSpeedDefaultRatio = 0.01;
  this->DragSpeedScaleSlow = 0.01;
  this->DragSpeedScaleFast = 10.0;
  memset(&this->ScrollbarClickDeltaToGrabCenter,0,0x410);
  (this->OsImePosRequest).x = -1.0;
  (this->OsImePosRequest).y = -1.0;
  (this->OsImePosSet).x = -1.0;
  (this->OsImePosSet).y = -1.0;
  this->ModalWindowDarkeningRatio = 0.0;
  (this->OverlayDrawList)._OwnerName = "##Overlay";
  this->LogEnabled = false;
  memset(&this->MouseCursor,0,0x170);
  this->LogFile = (FILE *)0x0;
  this->LogClipboard = (ImGuiTextBuffer *)0x0;
  this->LogStartDepth = 0;
  this->LogAutoExpandMaxDepth = 2;
  this->FramerateSecPerFrame[0] = 0.0;
  this->FramerateSecPerFrame[1] = 0.0;
  this->FramerateSecPerFrame[2] = 0.0;
  this->FramerateSecPerFrame[3] = 0.0;
  this->FramerateSecPerFrame[4] = 0.0;
  this->FramerateSecPerFrame[5] = 0.0;
  this->FramerateSecPerFrame[6] = 0.0;
  this->FramerateSecPerFrame[7] = 0.0;
  this->FramerateSecPerFrame[8] = 0.0;
  this->FramerateSecPerFrame[9] = 0.0;
  this->FramerateSecPerFrameIdx = 0;
  this->FramerateSecPerFrameAccum = 0.0;
  this->CaptureMouseNextFrame = -1;
  this->CaptureKeyboardNextFrame = -1;
  memset(this->TempBuffer,0,0xc01);
  return;
}

Assistant:

ImGuiContext()
    {
        Initialized = false;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        FontTexUvWhitePixel = ImVec2(0.0f, 0.0f);

        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        CurrentWindow = NULL;
        FocusedWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        HoveredId = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdPreviousFrame = 0;
        ActiveId = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdIsAlive = false;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdClickOffset = ImVec2(-1,-1);
        ActiveIdWindow = NULL;
        MovedWindow = NULL;
        MovedWindowMoveId = 0;
        SettingsDirtyTimer = 0.0f;

        SetNextWindowPosVal = ImVec2(0.0f, 0.0f);
        SetNextWindowSizeVal = ImVec2(0.0f, 0.0f);
        SetNextWindowCollapsedVal = false;
        SetNextWindowPosCond = 0;
        SetNextWindowSizeCond = 0;
        SetNextWindowContentSizeCond = 0;
        SetNextWindowCollapsedCond = 0;
        SetNextWindowFocus = false;
        SetNextWindowSizeConstraintCallback = NULL;
        SetNextWindowSizeConstraintCallbackUserData = NULL;
        SetNextTreeNodeOpenVal = false;
        SetNextTreeNodeOpenCond = 0;

        ScalarAsInputTextId = 0;
        DragCurrentValue = 0.0f;
        DragLastMouseDelta = ImVec2(0.0f, 0.0f);
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        DragSpeedScaleSlow = 0.01f;
        DragSpeedScaleFast = 10.0f;
        ScrollbarClickDeltaToGrabCenter = ImVec2(0.0f, 0.0f);
        memset(Tooltip, 0, sizeof(Tooltip));
        PrivateClipboard = NULL;
        OsImePosRequest = OsImePosSet = ImVec2(-1.0f, -1.0f);

        ModalWindowDarkeningRatio = 0.0f;
        OverlayDrawList._OwnerName = "##Overlay"; // Give it a name for debugging
        MouseCursor = ImGuiMouseCursor_Arrow;
        memset(MouseCursorData, 0, sizeof(MouseCursorData));

        LogEnabled = false;
        LogFile = NULL;
        LogClipboard = NULL;
        LogStartDepth = 0;
        LogAutoExpandMaxDepth = 2;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        CaptureMouseNextFrame = CaptureKeyboardNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }